

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O0

void __thiscall
wasm::JSPI::makeWrapperForImport
          (JSPI *this,Function *im,Module *module,Name suspender,bool wasmSplit)

{
  size_t *this_00;
  variant<wasm::Name,_wasm::HeapType> value;
  Name name;
  Name name_00;
  bool bVar1;
  Index IVar2;
  pointer pFVar3;
  GlobalGet *pGVar4;
  Type *__x;
  Block *this_01;
  pointer this_02;
  LocalSet *pLVar5;
  LocalGet *pLVar6;
  GlobalSet *item;
  uint *puVar7;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *pAVar8;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar9;
  optional<wasm::Type> type_;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  size_t local_268;
  char *pcStack_260;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> local_258;
  uintptr_t local_250;
  Type local_248;
  Signature local_240;
  HeapType local_230;
  uintptr_t local_228;
  undefined1 local_218 [12];
  uintptr_t local_208;
  uintptr_t local_200;
  size_t local_1f8;
  char *pcStack_1f0;
  uintptr_t local_1e0;
  size_t local_1d8;
  char *pcStack_1d0;
  uintptr_t local_1c8;
  Index local_1bc;
  _Optional_payload_base<unsigned_int> local_1b8;
  Type local_1b0;
  _Optional_payload_base<unsigned_int> local_1a8;
  optional<unsigned_int> returnIndex;
  Index supsenderCopyIndex;
  Block *block;
  Type *param;
  Iterator __end2;
  Iterator __begin2;
  Type *__range2;
  Index i;
  undefined1 local_128 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> params;
  Call *call;
  Name local_f8;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_e8;
  __single_object stub;
  allocator<char> local_a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string_view local_68;
  string_view local_58;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> local_48;
  __single_object wrapperIm;
  Builder builder;
  bool wasmSplit_local;
  Module *module_local;
  Function *im_local;
  JSPI *this_local;
  Name suspender_local;
  
  Builder::Builder((Builder *)&wrapperIm,module);
  std::make_unique<wasm::Function>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"import$",&local_a9);
  IString::toString_abi_cxx11_((string *)&stub,(IString *)im);
  std::operator+(&local_88,&local_a8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stub);
  wasm::Name::Name((Name *)&local_68,&local_88);
  local_58 = (string_view)Names::getValidFunctionName(module,(Name)local_68);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_48);
  wasm::Name::operator=((Name *)pFVar3,(Name *)&local_58);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&stub);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_48);
  wasm::Name::operator=(&(pFVar3->super_Importable).module,&(im->super_Importable).module);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_48);
  wasm::Name::operator=(&(pFVar3->super_Importable).base,&(im->super_Importable).base);
  std::make_unique<wasm::Function>();
  wasm::Name::Name(&local_f8,(im->super_Importable).super_Named.name.super_IString.str);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_e8);
  wasm::Name::operator=((Name *)pFVar3,&local_f8);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_e8);
  (pFVar3->type).id = (im->type).id;
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)MixedArena::alloc<wasm::Call>(&module->allocator);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_48);
  wasm::Name::operator=
            ((Name *)(params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 6),(Name *)pFVar3);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_128);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_128,&this->externref);
  pAVar8 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
           (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage + 2);
  pGVar4 = Builder::makeGlobalGet((Builder *)&wrapperIm,suspender,(Type)(this->externref).id);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (pAVar8,(Expression *)pGVar4);
  __range2._4_4_ = 0;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(im);
  this_00 = &__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::begin((Type *)this_00);
  PVar9 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
          wasm::Type::end((Type *)this_00);
  while( true ) {
    __end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)PVar9.index;
    param = PVar9.parent;
    bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                      ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                       &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                        index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                              &param);
    if (!bVar1) break;
    __x = wasm::Type::Iterator::operator*
                    ((Iterator *)
                     &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                      index);
    pAVar8 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             (params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + 2);
    pLVar6 = Builder::makeLocalGet((Builder *)&wrapperIm,__range2._4_4_,(Type)__x->id);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (pAVar8,(Expression *)pLVar6);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_128,__x);
    __range2._4_4_ = __range2._4_4_ + 1;
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
    PVar9.index = (size_t)__end2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                          .parent;
    PVar9.parent = param;
  }
  this_01 = Builder::makeBlock((Builder *)&wrapperIm,(Expression *)0x0);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_e8);
  returnIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       (_Optional_base<unsigned_int,_true,_true>)(this->externref).id;
  IVar2 = Builder::addVar(pFVar3,(Type)returnIndex.super__Optional_base<unsigned_int,_true,_true>.
                                       _M_payload.super__Optional_payload_base<unsigned_int>);
  std::optional<unsigned_int>::optional((optional<unsigned_int> *)&local_1a8);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_e8);
  local_1b0 = Function::getResults(pFVar3);
  bVar1 = wasm::Type::isConcrete(&local_1b0);
  if (bVar1) {
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get(&local_e8);
    this_02 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        (&local_e8);
    local_1c8 = (uintptr_t)Function::getResults(this_02);
    local_1bc = Builder::addVar(pFVar3,(Type)local_1c8);
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)&local_1b8,&local_1bc);
    local_1a8 = local_1b8;
  }
  local_1e0 = (this->externref).id;
  local_1d8 = suspender.super_IString.str._M_len;
  pcStack_1d0 = suspender.super_IString.str._M_str;
  pGVar4 = Builder::makeGlobalGet((Builder *)&wrapperIm,suspender,(Type)local_1e0);
  pLVar5 = Builder::makeLocalSet((Builder *)&wrapperIm,IVar2,(Expression *)pGVar4);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pLVar5);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_1a8);
  if (bVar1) {
    puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_1a8);
    pLVar5 = Builder::makeLocalSet
                       ((Builder *)&wrapperIm,*puVar7,
                        (Expression *)
                        params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar5);
  }
  else {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)
               params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
  }
  local_200 = (this->externref).id;
  local_1f8 = suspender.super_IString.str._M_len;
  pcStack_1f0 = suspender.super_IString.str._M_str;
  pLVar6 = Builder::makeLocalGet((Builder *)&wrapperIm,IVar2,(Type)local_200);
  name_00.super_IString.str._M_str = pcStack_1f0;
  name_00.super_IString.str._M_len = local_1f8;
  item = Builder::makeGlobalSet((Builder *)&wrapperIm,name_00,(Expression *)pLVar6);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(this_01->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)item);
  bVar1 = std::optional::operator_cast_to_bool((optional *)&local_1a8);
  if (bVar1) {
    puVar7 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)&local_1a8);
    IVar2 = *puVar7;
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (&local_e8);
    local_208 = (uintptr_t)Function::getResults(pFVar3);
    pLVar6 = Builder::makeLocalGet((Builder *)&wrapperIm,IVar2,(Type)local_208);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (&(this_01->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
               (Expression *)pLVar6);
  }
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_218);
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_218._0_8_;
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_218[8];
  type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_218._9_3_;
  Block::finalize(this_01,type_,Unknown);
  local_228 = (uintptr_t)Function::getResults(im);
  params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage[1].id = local_228;
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_e8);
  pFVar3->body = (Expression *)this_01;
  wasm::Type::Type(&local_248,(Tuple *)local_128);
  local_250 = params.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[1].id;
  Signature::Signature(&local_240,local_248,(Type)local_250);
  HeapType::HeapType(&local_230,local_240);
  pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                     (&local_48);
  (pFVar3->type).id = local_230.id;
  if (wasmSplit) {
    bVar1 = IString::operator==((IString *)im,(IString *)ModuleSplitting::LOAD_SECONDARY_MODULE);
    if (bVar1) {
      local_268 = ModuleSplitting::LOAD_SECONDARY_MODULE._0_8_;
      pcStack_260 = (char *)ModuleSplitting::LOAD_SECONDARY_MODULE._8_8_;
      std::variant<wasm::Name,wasm::HeapType>::variant<wasm::Name_const&,void,void,wasm::Name,void>
                ((variant<wasm::Name,wasm::HeapType> *)&local_280,
                 (Name *)ModuleSplitting::LOAD_SECONDARY_MODULE);
      name.super_IString.str._M_str = pcStack_260;
      name.super_IString.str._M_len = local_268;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_str = (char *)uStack_278;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u._M_first._M_storage.
      super_IString.str._M_len = local_280;
      value.super__Variant_base<wasm::Name,_wasm::HeapType>.
      super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
      super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
      super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._16_8_ = local_270;
      Builder::makeExport((Builder *)&local_258,name,value,Function);
      Module::addExport(module,&local_258);
      std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::~unique_ptr(&local_258);
    }
  }
  Module::removeFunction(module,(Name)(im->super_Importable).super_Named.name.super_IString.str);
  Module::addFunction(module,&local_e8);
  Module::addFunction(module,&local_48);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_128);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_e8);
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr(&local_48);
  return;
}

Assistant:

void makeWrapperForImport(Function* im,
                            Module* module,
                            Name suspender,
                            bool wasmSplit) {
    Builder builder(*module);
    auto wrapperIm = std::make_unique<Function>();
    wrapperIm->name = Names::getValidFunctionName(
      *module, std::string("import$") + im->name.toString());
    wrapperIm->module = im->module;
    wrapperIm->base = im->base;
    auto stub = std::make_unique<Function>();
    stub->name = Name(im->name.str);
    stub->type = im->type;

    auto* call = module->allocator.alloc<Call>();
    call->target = wrapperIm->name;

    // Add an externref as the first argument to the imported function.
    std::vector<Type> params;
    params.push_back(externref);
    call->operands.push_back(builder.makeGlobalGet(suspender, externref));
    Index i = 0;
    for (const auto& param : im->getParams()) {
      call->operands.push_back(builder.makeLocalGet(i, param));
      params.push_back(param);
      ++i;
    }
    auto* block = builder.makeBlock();
    // Store the suspender so it can be restored after the call in case it is
    // modified by another entry into a Wasm export.
    auto supsenderCopyIndex = Builder::addVar(stub.get(), externref);
    // If there's a return value we need to store it so it can be returned
    // after restoring the suspender.
    std::optional<Index> returnIndex;
    if (stub->getResults().isConcrete()) {
      returnIndex = Builder::addVar(stub.get(), stub->getResults());
    }
    block->list.push_back(builder.makeLocalSet(
      supsenderCopyIndex, builder.makeGlobalGet(suspender, externref)));
    if (returnIndex) {
      block->list.push_back(builder.makeLocalSet(*returnIndex, call));
    } else {
      block->list.push_back(call);
    }
    // Restore the suspender.
    block->list.push_back(builder.makeGlobalSet(
      suspender, builder.makeLocalGet(supsenderCopyIndex, externref)));
    if (returnIndex) {
      block->list.push_back(
        builder.makeLocalGet(*returnIndex, stub->getResults()));
    }
    block->finalize();
    call->type = im->getResults();
    stub->body = block;
    wrapperIm->type = Signature(Type(params), call->type);

    if (wasmSplit && im->name == ModuleSplitting::LOAD_SECONDARY_MODULE) {
      // In non-debug builds the name of the JSPI wrapper function for loading
      // the secondary module will be removed. Create an export of it so that
      // wasm-split can find it.
      module->addExport(
        builder.makeExport(ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ModuleSplitting::LOAD_SECONDARY_MODULE,
                           ExternalKind::Function));
    }
    module->removeFunction(im->name);
    module->addFunction(std::move(stub));
    module->addFunction(std::move(wrapperIm));
  }